

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O0

void canvas_fixlinesfor(_glist *x,t_text *text)

{
  _glist *p_Var1;
  char local_118 [8];
  char tag [128];
  _outconnect *oc;
  t_linetraverser t;
  t_text *text_local;
  _glist *x_local;
  
  t._112_8_ = text;
  linetraverser_start((t_linetraverser *)&oc,x);
  while (tag._120_8_ = linetraverser_next((t_linetraverser *)&oc),
        (_outconnect *)tag._120_8_ != (_outconnect *)0x0) {
    if ((t.tr_x == (_glist *)t._112_8_) || (t._16_8_ == t._112_8_)) {
      sprintf(local_118,"l%lx",tag._120_8_);
      p_Var1 = glist_getcanvas(x);
      pdgui_vmess((char *)0x0,"crs iiii",p_Var1,"coords",local_118,(ulong)(uint)t.tr_x22,t.tr_y22,
                  t.tr_lx1,t.tr_ly1);
    }
  }
  return;
}

Assistant:

void canvas_fixlinesfor(t_canvas *x, t_text *text)
{
    t_linetraverser t;
    t_outconnect *oc;

    linetraverser_start(&t, x);
    while ((oc = linetraverser_next(&t)))
    {
        if (t.tr_ob == text || t.tr_ob2 == text)
        {
            char tag[128];
            sprintf(tag, "l%lx", oc);
            pdgui_vmess(0, "crs iiii",
                glist_getcanvas(x), "coords", tag,
                t.tr_lx1,t.tr_ly1, t.tr_lx2,t.tr_ly2);
        }
    }
}